

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weak.c
# Opt level: O0

sexp_conflict
sexp_init_library(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,char *version
                 ,char *abi)

{
  undefined8 uVar1;
  long lVar2;
  int iVar3;
  int *piVar4;
  undefined8 in_RCX;
  long in_RDI;
  char *in_R8;
  char *in_R9;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_conflict op;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict t;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict name;
  int **local_80;
  undefined8 local_78;
  int *local_70;
  undefined8 *local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 local_40;
  char *local_38;
  char *local_30;
  undefined8 local_28;
  long local_10;
  
  local_40 = 0x43e;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_10 = in_RDI;
  memset(&local_50,0,0x10);
  local_58 = 0x43e;
  memset(&local_68,0,0x10);
  local_70 = (int *)0x43e;
  memset(&local_80,0,0x10);
  iVar3 = strcmp(local_30,"0.11.0");
  if ((iVar3 == 0) && (iVar3 = strncmp(local_38,"cv-gm*uh",8), lVar2 = local_10, iVar3 == 0)) {
    local_50 = &local_40;
    local_48 = *(undefined8 *)(local_10 + 0x6080);
    *(undefined8 ***)(local_10 + 0x6080) = &local_50;
    local_68 = &local_58;
    local_60 = *(undefined8 *)(local_10 + 0x6080);
    *(undefined8 ***)(local_10 + 0x6080) = &local_68;
    local_80 = &local_70;
    local_78 = *(undefined8 *)(local_10 + 0x6080);
    *(int ****)(local_10 + 0x6080) = &local_80;
    local_58 = 0x51;
    local_40 = sexp_c_string(local_10,"ephemeron?",0xffffffffffffffff);
    local_70 = (int *)sexp_make_type_predicate_op(lVar2,0,2,local_40,local_58);
    lVar2 = local_10;
    uVar1 = local_28;
    local_40 = sexp_intern(local_10,"ephemeron?",0xffffffffffffffff);
    sexp_env_define(lVar2,uVar1,local_40,local_70);
    lVar2 = local_10;
    local_40 = sexp_c_string(local_10,"ephemeron-key",0xffffffffffffffff);
    local_70 = (int *)sexp_make_getter_op(lVar2,0,3,local_40,local_58,1);
    lVar2 = local_10;
    uVar1 = local_28;
    local_40 = sexp_intern(local_10,"ephemeron-key",0xffffffffffffffff);
    sexp_env_define(lVar2,uVar1,local_40,local_70);
    lVar2 = local_10;
    local_40 = sexp_c_string(local_10,"ephemeron-value",0xffffffffffffffff);
    local_70 = (int *)sexp_make_getter_op(lVar2,0,3,local_40,local_58);
    lVar2 = local_10;
    uVar1 = local_28;
    local_40 = sexp_intern(local_10,"ephemeron-value",0xffffffffffffffff);
    sexp_env_define(lVar2,uVar1,local_40,local_70);
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"make-ephemeron",2,0,"sexp_make_ephemeron_op",
                                 sexp_make_ephemeron_op,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x51;
      local_70[0xb] = 0;
    }
    piVar4 = (int *)sexp_define_foreign_aux
                              (local_10,local_28,"ephemeron-broken?",1,0,"sexp_ephemeron_brokenp_op"
                               ,sexp_ephemeron_brokenp_op,0);
    if ((((ulong)piVar4 & 3) == 0) && (*piVar4 == 0x1b)) {
      piVar4[10] = 1;
      piVar4[0xb] = 0;
      piVar4[0xc] = 0x51;
      piVar4[0xd] = 0;
    }
    *(undefined8 *)(local_10 + 0x6080) = local_48;
    return (sexp_conflict)0x43e;
  }
  return (sexp_conflict)0xb3e;
}

Assistant:

sexp sexp_init_library (sexp ctx, sexp self, sexp_sint_t n, sexp env, const char* version, const sexp_abi_identifier_t abi) {
#if 0
  sexp v;
  int sexp_weak_vector_id;
#endif
  sexp_gc_var3(name, t, op);
  if (!(sexp_version_compatible(ctx, version, sexp_version)
        && sexp_abi_compatible(ctx, abi, SEXP_ABI_IDENTIFIER)))
    return SEXP_ABI_ERROR;
  sexp_gc_preserve3(ctx, name, t, op);

#if SEXP_USE_WEAK_REFERENCES
  t = sexp_make_fixnum(SEXP_EPHEMERON);
  op = sexp_make_type_predicate(ctx, name=sexp_c_string(ctx,"ephemeron?",-1), t);
  sexp_env_define(ctx, env, name=sexp_intern(ctx, "ephemeron?", -1), op);
  op = sexp_make_getter(ctx, name=sexp_c_string(ctx, "ephemeron-key", -1), t, SEXP_ZERO);
  sexp_env_define(ctx, env, name=sexp_intern(ctx, "ephemeron-key", -1), op);
  op = sexp_make_getter(ctx, name=sexp_c_string(ctx, "ephemeron-value", -1), t, SEXP_ONE);
  sexp_env_define(ctx, env, name=sexp_intern(ctx, "ephemeron-value", -1), op);
  op = sexp_define_foreign(ctx, env, "make-ephemeron", 2, sexp_make_ephemeron_op);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_EPHEMERON);
  }
  op = sexp_define_foreign(ctx, env, "ephemeron-broken?", 1, sexp_ephemeron_brokenp_op);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_EPHEMERON);
  }
#endif

#if 0
  name = sexp_c_string(ctx, "Weak-Vector", -1);
  t = sexp_register_simple_type(ctx, name, SEXP_FALSE, SEXP_ZERO);
  v = sexp_type_by_index(ctx, SEXP_VECTOR);
  sexp_weak_vector_id = sexp_type_tag(t);
  sexp_type_weak_base(t) = sexp_type_field_base(v);
  sexp_type_weak_len_off(t) = sexp_type_field_len_off(v);
  sexp_type_weak_len_scale(t) = sexp_type_field_len_scale(v);

  op = sexp_make_type_predicate(ctx, name=sexp_c_string(ctx,"weak-vector?",-1), t);
  sexp_env_define(ctx, env, name=sexp_intern(ctx, "weak-vector?", -1), op);
  op = sexp_define_foreign(ctx, env, "make-weak-vector", 1, sexp_make_weak_vector);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(sexp_weak_vector_id);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "weak-vector-length", 2, sexp_weak_vector_length);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_weak_vector_id);
  }
  op = sexp_define_foreign(ctx, env, "weak-vector-ref", 2, sexp_weak_vector_ref);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_weak_vector_id);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "weak-vector-set!", 3, sexp_weak_vector_set);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_weak_vector_id);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
#endif

  sexp_gc_release3(ctx);
  return SEXP_VOID;
}